

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O3

int sat_solver_solve_internal(sat_solver *s)

{
  ABC_INT64_T *pAVar1;
  float fVar2;
  double *pdVar3;
  word *pwVar4;
  lit *plVar5;
  bool bVar6;
  double dVar7;
  int iVar8;
  uint uVar9;
  int *orderpos;
  word wVar10;
  int *piVar11;
  int *piVar12;
  float *activity;
  char *pcVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  uint *puVar17;
  char cVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  int iVar29;
  float fVar30;
  double dVar31;
  timespec ts;
  uint *local_b8;
  int local_ac;
  ulong local_a8;
  timespec local_80;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  double local_48;
  int *local_40;
  long local_38;
  
  if ((s->unit_lits).size < 0) {
LAB_00552902:
    __assert_fail("k <= v->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satVec.h"
                  ,0x30,"void veci_resize(veci *, int)");
  }
  (s->unit_lits).size = 0;
  s->nCalls = s->nCalls + 1;
  if (0 < s->verbosity) {
    puts("==================================[MINISAT]===================================");
    puts("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |");
    puts("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |");
    puts("==============================================================================");
  }
  local_40 = &s->root_level;
  uVar21 = 0;
LAB_005509f0:
  uVar9 = (s->stats).learnts;
  dVar31 = 0.0;
  if (uVar9 != 0) {
    dVar31 = (double)(s->stats).learnts_literals / (double)uVar9;
  }
  iVar19 = (int)uVar21;
  if (s->nRuntimeLimit != 0) {
    iVar8 = clock_gettime(3,&local_80);
    if (iVar8 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    if (s->nRuntimeLimit < lVar14) {
      cVar18 = '\0';
LAB_005526ba:
      if (0 < s->verbosity) {
        puts("==============================================================================");
      }
      sat_solver_canceluntil(s,s->root_level);
      if ((cVar18 == '\x01') && (0 < (s->user_vars).size)) {
        lVar14 = 0;
        do {
          iVar19 = (s->user_vars).ptr[lVar14];
          if (((long)iVar19 < 0) || (s->size <= iVar19)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          iVar19 = s->model[iVar19];
          uVar9 = (s->user_values).size;
          piVar12 = (s->user_values).ptr;
          if (uVar9 == (s->user_values).cap) {
            iVar8 = (uVar9 >> 1) * 3;
            if ((int)uVar9 < 4) {
              iVar8 = uVar9 * 2;
            }
            if (piVar12 == (int *)0x0) {
              piVar12 = (int *)malloc((long)iVar8 << 2);
            }
            else {
              piVar12 = (int *)realloc(piVar12,(long)iVar8 << 2);
            }
            (s->user_values).ptr = piVar12;
            if (piVar12 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->user_values).cap * 9.5367431640625e-07,0),
                     (double)iVar8 * 9.5367431640625e-07);
              fflush(_stdout);
            }
            (s->user_values).cap = iVar8;
            uVar9 = (s->user_values).size;
          }
          (s->user_values).size = uVar9 + 1;
          piVar12[(int)uVar9] = (uint)(iVar19 == 1);
          lVar14 = lVar14 + 1;
        } while (lVar14 < (s->user_vars).size);
      }
      return (int)cVar18;
    }
  }
  if (0 < s->verbosity) {
    printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n",
           SUB84((double)(s->stats).conflicts,0),(double)(s->stats).clauses,
           (double)(s->stats).clauses_literals,0,(double)(s->stats).learnts,
           (double)(s->stats).learnts_literals,dVar31,s->progress_estimate * 100.0);
    fflush(_stdout);
  }
  if (iVar19 == 0) {
    iVar8 = 0;
    iVar23 = 0;
  }
  else {
    iVar28 = 1;
    iVar23 = 0;
    do {
      iVar23 = iVar23 + 1;
      iVar8 = iVar28 * 2;
      iVar28 = iVar28 * 2 + 1;
    } while (iVar8 < iVar19);
  }
  if (iVar8 != iVar19) {
    do {
      iVar23 = iVar23 + -1;
      uVar16 = (long)(int)uVar21 % (long)(iVar8 >> 1);
      uVar21 = uVar16 & 0xffffffff;
      iVar8 = (iVar8 >> 1) + -1;
    } while (iVar8 != (int)uVar16);
  }
  dVar31 = ldexp(1.0,iVar23);
  if (s->root_level != (s->trail_lim).size) {
    __assert_fail("s->root_level == sat_solver_dl(s)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                  ,0x720,"lbool sat_solver_search(sat_solver *, ABC_INT64_T)");
  }
  iVar8 = s->fNotUseRandom;
  uVar9 = s->nRestarts;
  s->nRestarts = uVar9 + 1;
  (s->stats).starts = (s->stats).starts + 1;
  local_b8 = (uint *)malloc(0x10);
  if (((uVar9 & 1) == 0) && (0 < (s->act_vars).size)) {
    lVar14 = 0;
    do {
      pdVar3 = s->factors;
      if (pdVar3 == (double *)0x0) goto LAB_00550f50;
      iVar23 = (s->act_vars).ptr[lVar14];
      iVar28 = s->VarActType;
      if (iVar28 == 2) {
        dVar7 = pdVar3[iVar23];
        if (dVar7 < 1.0) {
          __assert_fail("a >= 1.0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilDouble.h"
                        ,0x41,"xdbl Xdbl_FromDouble(double)");
        }
        uVar21 = ((ulong)dVar7 >> 0x34) - 0x3ff;
        if (0xffff < uVar21) goto LAB_0055280a;
        uVar16 = s->var_inc;
        pwVar4 = s->activity;
        uVar26 = uVar21 << 0x30 | (ulong)dVar7 >> 5 & 0x7fffffffffff | 0x800000000000;
        uVar21 = uVar26;
        if (uVar26 < uVar16) {
          uVar21 = uVar16;
        }
        if (uVar16 < uVar26) {
          uVar26 = uVar16;
        }
        uVar16 = uVar21 >> 0x20 & 0xffff;
        uVar24 = uVar26 >> 0x20 & 0xffff;
        uVar24 = (uVar16 * (uVar26 & 0xffffffff) >> 0xf) + (uVar24 * (uVar21 & 0xffffffff) >> 0xf) +
                 ((uVar21 & 0xffffffff) * (uVar26 & 0xffffffff) >> 0x2f | uVar16 * uVar24 * 0x20000)
        ;
        uVar22 = uVar24 >> (0xffffffffffff < uVar24);
        uVar16 = pwVar4[iVar23];
        uVar26 = (ulong)(0xffffffffffff < uVar24) + (uVar26 >> 0x30) + (uVar21 >> 0x30);
        uVar21 = 0xffffffffffffffff;
        if (uVar26 < 0x10000) {
          if ((uVar22 & 0xffff800000000000) != 0x800000000000) goto LAB_0055280a;
          uVar21 = uVar26 << 0x30 | uVar22;
        }
        uVar26 = uVar21;
        if (uVar21 < uVar16) {
          uVar26 = uVar16;
        }
        if (uVar16 < uVar21) {
          uVar21 = uVar16;
        }
        uVar16 = ((uVar21 & 0xffffffffffff) >>
                 ((char)(uVar26 >> 0x30) - (char)(uVar21 >> 0x30) & 0x3fU)) +
                 (uVar26 & 0xffffffffffff);
        uVar21 = (ulong)(0xffffffffffff < uVar16) + (uVar26 >> 0x30);
        uVar16 = uVar16 >> (0xffffffffffff < uVar16);
        if (uVar21 < 0x10000) {
          if ((uVar16 & 0x1800000000000) != 0x800000000000) goto LAB_0055280a;
          uVar16 = uVar21 << 0x30 | uVar16;
          pwVar4[iVar23] = uVar16;
          if (0x14c924d692ca61b < uVar16) goto LAB_00550ed4;
        }
        else {
          pwVar4[iVar23] = 0xffffffffffffffff;
LAB_00550ed4:
          act_var_rescale(s);
        }
        piVar12 = s->orderpos;
        uVar21 = (ulong)piVar12[iVar23];
        if (uVar21 != 0xffffffffffffffff) {
          piVar11 = (s->order).ptr;
          lVar15 = (long)piVar11[uVar21];
          if (piVar12[iVar23] == 0) {
LAB_00550f3f:
            uVar20 = 0;
          }
          else {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar21;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar23 = piVar11[(int)uVar27];
              uVar20 = uVar9;
              if (uVar16 <= pwVar4[iVar23]) break;
              piVar11[(int)uVar9] = iVar23;
              piVar12[iVar23] = uVar9;
              uVar21 = (ulong)uVar27;
              uVar20 = uVar27;
            } while (2 < uVar9);
          }
LAB_00550f47:
          piVar11[(int)uVar20] = (int)lVar15;
          piVar12[lVar15] = uVar20;
        }
      }
      else {
        if (iVar28 == 1) {
          dVar7 = (double)s->var_inc * pdVar3[iVar23] + (double)s->activity[iVar23];
          s->activity[iVar23] = (word)dVar7;
          if (1e+100 < dVar7) {
            act_var_rescale(s);
          }
          piVar12 = s->orderpos;
          uVar21 = (ulong)piVar12[iVar23];
          if (uVar21 == 0xffffffffffffffff) goto LAB_00550f50;
          piVar11 = (s->order).ptr;
          lVar15 = (long)piVar11[uVar21];
          if (piVar12[iVar23] == 0) goto LAB_00550f3f;
          pwVar4 = s->activity;
          uVar16 = pwVar4[lVar15];
          do {
            uVar9 = (uint)uVar21;
            uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
            iVar23 = piVar11[(int)uVar27];
            uVar20 = uVar9;
            if (uVar16 <= pwVar4[iVar23]) break;
            piVar11[(int)uVar9] = iVar23;
            piVar12[iVar23] = uVar9;
            uVar21 = (ulong)uVar27;
            uVar20 = uVar27;
          } while (2 < uVar9);
          goto LAB_00550f47;
        }
        if (iVar28 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                        ,0x195,"void act_var_bump_factor(sat_solver *, int)");
        }
        wVar10 = (long)(int)((float)pdVar3[iVar23] * (float)(uint)s->var_inc) + s->activity[iVar23];
        s->activity[iVar23] = wVar10;
        if ((int)wVar10 < 0) {
          act_var_rescale(s);
        }
        piVar12 = s->orderpos;
        uVar21 = (ulong)piVar12[iVar23];
        if (uVar21 != 0xffffffffffffffff) {
          piVar11 = (s->order).ptr;
          lVar15 = (long)piVar11[uVar21];
          if (piVar12[iVar23] != 0) {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar21;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar23 = piVar11[(int)uVar27];
              uVar20 = uVar9;
              if (uVar16 <= pwVar4[iVar23]) break;
              piVar11[(int)uVar9] = iVar23;
              piVar12[iVar23] = uVar9;
              uVar21 = (ulong)uVar27;
              uVar20 = uVar27;
            } while (2 < uVar9);
            goto LAB_00550f47;
          }
          goto LAB_00550f3f;
        }
      }
LAB_00550f50:
      lVar14 = lVar14 + 1;
    } while (lVar14 < (s->act_vars).size);
  }
  if ((s->pGlobalVars != (int *)0x0) && (0 < (s->act_vars).size)) {
    lVar14 = 0;
    do {
      if ((s->pGlobalVars == (int *)0x0) ||
         (iVar23 = (s->act_vars).ptr[lVar14], s->pGlobalVars[iVar23] == 0)) goto LAB_005512e0;
      iVar28 = s->VarActType;
      if (iVar28 == 2) {
        uVar21 = s->var_inc;
        uVar16 = 0x1c00000000000;
        if (uVar21 < 0x1c00000000000) {
          uVar16 = uVar21;
        }
        if (uVar21 < 0x1c00000000001) {
          uVar21 = 0x1c00000000000;
        }
        pwVar4 = s->activity;
        uVar26 = uVar21 >> 0x20 & 0xffff;
        uVar24 = uVar16 >> 0x20 & 0xffff;
        uVar24 = (uVar26 * (uVar16 & 0xffffffff) >> 0xf) + (uVar24 * (uVar21 & 0xffffffff) >> 0xf) +
                 ((uVar21 & 0xffffffff) * (uVar16 & 0xffffffff) >> 0x2f | uVar26 * uVar24 * 0x20000)
        ;
        uVar22 = uVar24 >> (0xffffffffffff < uVar24);
        uVar26 = pwVar4[iVar23];
        uVar16 = (ulong)(0xffffffffffff < uVar24) + (uVar16 >> 0x30) + (uVar21 >> 0x30);
        uVar21 = 0xffffffffffffffff;
        if (uVar16 < 0x10000) {
          if ((uVar22 & 0xffff800000000000) != 0x800000000000) goto LAB_0055280a;
          uVar21 = uVar16 << 0x30 | uVar22;
        }
        uVar16 = uVar21;
        if (uVar21 < uVar26) {
          uVar16 = uVar26;
        }
        if (uVar26 < uVar21) {
          uVar21 = uVar26;
        }
        uVar26 = ((uVar21 & 0xffffffffffff) >>
                 ((char)(uVar16 >> 0x30) - (char)(uVar21 >> 0x30) & 0x3fU)) +
                 (uVar16 & 0xffffffffffff);
        uVar21 = (ulong)(0xffffffffffff < uVar26) + (uVar16 >> 0x30);
        uVar26 = uVar26 >> (0xffffffffffff < uVar26);
        if (uVar21 < 0x10000) {
          if ((uVar26 & 0x1800000000000) != 0x800000000000) goto LAB_0055280a;
          uVar26 = uVar21 << 0x30 | uVar26;
          pwVar4[iVar23] = uVar26;
          if (0x14c924d692ca61b < uVar26) goto LAB_00551264;
        }
        else {
          pwVar4[iVar23] = 0xffffffffffffffff;
LAB_00551264:
          act_var_rescale(s);
        }
        piVar12 = s->orderpos;
        uVar21 = (ulong)piVar12[iVar23];
        if (uVar21 != 0xffffffffffffffff) {
          piVar11 = (s->order).ptr;
          lVar15 = (long)piVar11[uVar21];
          if (piVar12[iVar23] == 0) {
LAB_005512cf:
            uVar20 = 0;
          }
          else {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar21;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar23 = piVar11[(int)uVar27];
              uVar20 = uVar9;
              if (uVar16 <= pwVar4[iVar23]) break;
              piVar11[(int)uVar9] = iVar23;
              piVar12[iVar23] = uVar9;
              uVar21 = (ulong)uVar27;
              uVar20 = uVar27;
            } while (2 < uVar9);
          }
LAB_005512d7:
          piVar11[(int)uVar20] = (int)lVar15;
          piVar12[lVar15] = uVar20;
        }
      }
      else {
        if (iVar28 == 1) {
          dVar7 = (double)s->var_inc * 3.0 + (double)s->activity[iVar23];
          s->activity[iVar23] = (word)dVar7;
          if (1e+100 < dVar7) {
            act_var_rescale(s);
          }
          piVar12 = s->orderpos;
          uVar21 = (ulong)piVar12[iVar23];
          if (uVar21 == 0xffffffffffffffff) goto LAB_005512e0;
          piVar11 = (s->order).ptr;
          lVar15 = (long)piVar11[uVar21];
          if (piVar12[iVar23] == 0) goto LAB_005512cf;
          pwVar4 = s->activity;
          uVar16 = pwVar4[lVar15];
          do {
            uVar9 = (uint)uVar21;
            uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
            iVar23 = piVar11[(int)uVar27];
            uVar20 = uVar9;
            if (uVar16 <= pwVar4[iVar23]) break;
            piVar11[(int)uVar9] = iVar23;
            piVar12[iVar23] = uVar9;
            uVar21 = (ulong)uVar27;
            uVar20 = uVar27;
          } while (2 < uVar9);
          goto LAB_005512d7;
        }
        if (iVar28 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                        ,0x176,"void act_var_bump_global(sat_solver *, int)");
        }
        wVar10 = ((long)((s->var_inc << 0x20) * 3) >> 0x20) + s->activity[iVar23];
        s->activity[iVar23] = wVar10;
        if ((int)wVar10 < 0) {
          act_var_rescale(s);
        }
        piVar12 = s->orderpos;
        uVar21 = (ulong)piVar12[iVar23];
        if (uVar21 != 0xffffffffffffffff) {
          piVar11 = (s->order).ptr;
          lVar15 = (long)piVar11[uVar21];
          if (piVar12[iVar23] != 0) {
            pwVar4 = s->activity;
            uVar16 = pwVar4[lVar15];
            do {
              uVar9 = (uint)uVar21;
              uVar27 = (int)((uVar9 - ((int)(uVar9 - 1) >> 0x1f)) + -1) >> 1;
              iVar23 = piVar11[(int)uVar27];
              uVar20 = uVar9;
              if (uVar16 <= pwVar4[iVar23]) break;
              piVar11[(int)uVar9] = iVar23;
              piVar12[iVar23] = uVar9;
              uVar21 = (ulong)uVar27;
              uVar20 = uVar27;
            } while (2 < uVar9);
            goto LAB_005512d7;
          }
          goto LAB_005512cf;
        }
      }
LAB_005512e0:
      lVar14 = lVar14 + 1;
    } while (lVar14 < (s->act_vars).size);
  }
  local_48 = 0.019999999552965164;
  if (iVar8 != 0) {
    local_48 = 0.0;
  }
  local_38 = (long)(dVar31 * 100.0);
  local_ac = 4;
  uVar21 = 0;
  local_50 = 0;
LAB_00551337:
  while (uVar9 = sat_solver_propagate(s), uVar9 != 0) {
    pAVar1 = &(s->stats).conflicts;
    *pAVar1 = *pAVar1 + 1;
    if ((s->trail_lim).size == s->root_level) {
      sat_solver_analyze_final(s,uVar9,0);
      cVar18 = -1;
      goto LAB_005525bf;
    }
    if ((int)uVar21 < 0) goto LAB_00552902;
    plVar5 = s->trail;
    iVar8 = s->qtail;
    if (local_ac == 0) {
      if (local_b8 == (uint *)0x0) {
        local_b8 = (uint *)malloc(0);
      }
      else {
        local_b8 = (uint *)realloc(local_b8,0);
      }
      if (local_b8 == (uint *)0x0) {
        sat_solver_solve_internal_cold_3();
        goto LAB_005529be;
      }
    }
    local_50 = local_50 + 1;
    iVar8 = iVar8 + -1;
    *local_b8 = 0xfffffffe;
    uVar20 = 0xfffffffe;
    local_a8 = 1;
    iVar23 = 0;
    do {
      if (uVar9 == 0) {
        __assert_fail("h != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x396,"void sat_solver_analyze(sat_solver *, int, veci *)");
      }
      if ((uVar9 & 1) == 0) {
        uVar27 = (s->Mem).uPageMask & uVar9;
        if (uVar27 == 0) {
LAB_00552848:
          __assert_fail("k",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satClause.h"
                        ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
        }
        puVar17 = (uint *)((s->Mem).pPages[(int)uVar9 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                          (int)uVar27);
        if ((*puVar17 & 1) != 0) {
          piVar12 = (s->act_clas).ptr;
          uVar9 = puVar17[(ulong)(*puVar17 >> 0xb) + 1];
          if (s->ClaActType == 0) {
            piVar11 = piVar12 + (int)uVar9;
            *piVar11 = *piVar11 + s->cla_inc;
            if (*piVar11 < 0) {
              uVar9 = (s->act_clas).size;
              if (s->ClaActType != 0) {
                if (0 < (int)uVar9) {
                  uVar21 = 0;
                  do {
                    piVar12[uVar21] = (int)((float)piVar12[uVar21] * 1e-20);
                    uVar21 = uVar21 + 1;
                  } while (uVar9 != uVar21);
                }
                fVar30 = (float)s->cla_inc;
                goto LAB_005517fb;
              }
              if (0 < (int)uVar9) {
                lVar14 = 0;
                do {
                  piVar12[lVar14] = (uint)piVar12[lVar14] >> 0xe;
                  lVar14 = lVar14 + 1;
                } while (lVar14 < (s->act_clas).size);
              }
              uVar9 = s->cla_inc >> 0xe;
              if (uVar9 < 0x401) {
                uVar9 = 0x400;
              }
              goto LAB_00551800;
            }
          }
          else {
            fVar30 = (float)s->cla_inc;
            fVar2 = (float)piVar12[(int)uVar9];
            piVar12[(int)uVar9] = (int)(fVar2 + fVar30);
            if (1e+20 < fVar2 + fVar30) {
              lVar14 = (long)(s->act_clas).size;
              if (0 < lVar14) {
                lVar15 = 0;
                do {
                  piVar12[lVar15] = (int)((float)piVar12[lVar15] * 1e-20);
                  lVar15 = lVar15 + 1;
                } while (lVar14 != lVar15);
              }
LAB_005517fb:
              uVar9 = (uint)(long)(fVar30 * 1e-20);
LAB_00551800:
              s->cla_inc = uVar9;
            }
          }
        }
        if ((uint)(uVar20 != 0xfffffffe) < *puVar17 >> 0xb) {
          uVar21 = (ulong)(uVar20 != 0xfffffffe);
          do {
            iVar28 = (int)puVar17[uVar21 + 1] >> 1;
            pcVar13 = s->tags;
            if ((pcVar13[iVar28] == '\0') && (0 < s->levels[iVar28])) {
              uVar9 = (s->tagged).size;
              piVar12 = (s->tagged).ptr;
              if (uVar9 == (s->tagged).cap) {
                iVar29 = (uVar9 >> 1) * 3;
                if ((int)uVar9 < 4) {
                  iVar29 = uVar9 * 2;
                }
                if (piVar12 == (int *)0x0) {
                  piVar12 = (int *)malloc((long)iVar29 << 2);
                }
                else {
                  piVar12 = (int *)realloc(piVar12,(long)iVar29 << 2);
                }
                (s->tagged).ptr = piVar12;
                if (piVar12 == (int *)0x0) {
                  printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                         SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                         (double)iVar29 * 9.5367431640625e-07);
                  fflush(_stdout);
                }
                (s->tagged).cap = iVar29;
                uVar9 = (s->tagged).size;
                pcVar13 = s->tags;
              }
              (s->tagged).size = uVar9 + 1;
              piVar12[(int)uVar9] = iVar28;
              pcVar13[iVar28] = '\x01';
              act_var_bump(s,iVar28);
              if (s->levels[iVar28] == (s->trail_lim).size) {
                iVar23 = iVar23 + 1;
              }
              else {
                uVar9 = puVar17[uVar21 + 1];
                iVar28 = (int)local_a8;
                if (iVar28 == local_ac) {
                  local_ac = (int)(local_a8 >> 1) * 3;
                  if (iVar28 < 4) {
                    local_ac = iVar28 * 2;
                  }
                  if (local_b8 == (uint *)0x0) {
                    local_b8 = (uint *)malloc((long)local_ac << 2);
                  }
                  else {
                    local_b8 = (uint *)realloc(local_b8,(long)local_ac << 2);
                  }
                  if (local_b8 == (uint *)0x0) {
                    sat_solver_solve_internal_cold_2();
                    goto LAB_0055292f;
                  }
                }
                local_a8 = (ulong)(iVar28 + 1);
                local_b8[iVar28] = uVar9;
              }
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 < *puVar17 >> 0xb);
        }
      }
      else {
        iVar28 = (int)uVar9 >> 2;
        pcVar13 = s->tags;
        if ((pcVar13[iVar28] == '\0') && (0 < s->levels[iVar28])) {
          uVar20 = (s->tagged).size;
          piVar12 = (s->tagged).ptr;
          if (uVar20 == (s->tagged).cap) {
            iVar29 = (uVar20 >> 1) * 3;
            if ((int)uVar20 < 4) {
              iVar29 = uVar20 * 2;
            }
            if (piVar12 == (int *)0x0) {
              piVar12 = (int *)malloc((long)iVar29 << 2);
            }
            else {
              piVar12 = (int *)realloc(piVar12,(long)iVar29 << 2);
            }
            (s->tagged).ptr = piVar12;
            if (piVar12 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                     (double)iVar29 * 9.5367431640625e-07);
              fflush(_stdout);
            }
            (s->tagged).cap = iVar29;
            uVar20 = (s->tagged).size;
            pcVar13 = s->tags;
          }
          (s->tagged).size = uVar20 + 1;
          piVar12[(int)uVar20] = iVar28;
          pcVar13[iVar28] = '\x01';
          act_var_bump(s,iVar28);
          if (s->levels[iVar28] == (s->trail_lim).size) {
            iVar23 = iVar23 + 1;
          }
          else {
            iVar28 = (int)local_a8;
            if (iVar28 == local_ac) {
              local_ac = (int)(local_a8 >> 1) * 3;
              if (iVar28 < 4) {
                local_ac = iVar28 * 2;
              }
              if (local_b8 == (uint *)0x0) {
                local_b8 = (uint *)malloc((long)local_ac << 2);
              }
              else {
                local_b8 = (uint *)realloc(local_b8,(long)local_ac << 2);
              }
              if (local_b8 == (uint *)0x0) {
                sat_solver_solve_internal_cold_1();
                goto LAB_0055299a;
              }
            }
            local_a8 = (ulong)(iVar28 + 1);
            local_b8[iVar28] = (int)uVar9 >> 1;
          }
        }
      }
      puVar17 = (uint *)(plVar5 + iVar8);
      do {
        uVar20 = *puVar17;
        puVar17 = puVar17 + -1;
        iVar8 = iVar8 + -1;
      } while (s->tags[(int)uVar20 >> 1] == '\0');
      uVar9 = s->reasons[(int)uVar20 >> 1];
      bVar6 = 1 < iVar23;
      iVar23 = iVar23 + -1;
    } while (bVar6);
    *local_b8 = uVar20 ^ 1;
    uVar21 = 1;
    if (1 < (int)local_a8) {
      local_70 = local_a8;
      uVar9 = 0;
      uVar21 = 1;
      do {
        uVar9 = uVar9 | 1 << (*(byte *)(s->levels + ((int)local_b8[uVar21] >> 1)) & 0x1f);
        uVar21 = uVar21 + 1;
      } while (local_a8 != uVar21);
      uVar21 = 1;
      uVar16 = 1;
      uVar26 = local_a8;
      do {
        uVar20 = local_b8[uVar16];
        if (s->reasons[(int)uVar20 >> 1] == 0) {
LAB_00552170:
          local_b8[(int)uVar21] = uVar20;
          uVar21 = (ulong)((int)uVar21 + 1);
        }
        else {
          if ((s->stack).size < 0) goto LAB_00552902;
          iVar8 = (s->tagged).size;
          (s->stack).size = 0;
          iVar23 = 0;
          piVar12 = (s->stack).ptr;
          if ((s->stack).cap == 0) {
            if (piVar12 == (int *)0x0) {
              piVar12 = (int *)malloc(0);
            }
            else {
              piVar12 = (int *)realloc(piVar12,0);
            }
            (s->stack).ptr = piVar12;
            if (piVar12 == (int *)0x0) {
              printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                     SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),0);
              fflush(_stdout);
            }
            (s->stack).cap = 0;
            iVar23 = (s->stack).size;
          }
          (s->stack).size = iVar23 + 1;
          piVar12[iVar23] = (int)uVar20 >> 1;
          iVar23 = (s->stack).size;
          if (iVar23 != 0) {
            local_58 = (long)iVar8;
            local_68 = uVar16;
            local_60 = uVar21;
            do {
              piVar12 = s->reasons;
              piVar11 = (s->stack).ptr;
              (s->stack).size = iVar23 + -1;
              uVar20 = piVar12[piVar11[(long)iVar23 + -1]];
              if (uVar20 == 0) {
                __assert_fail("s->reasons[v] != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                              ,0x309,"int sat_solver_lit_removable(sat_solver *, int, int)");
              }
              if ((uVar20 & 1) != 0) {
                iVar28 = (int)uVar20 >> 2;
                pcVar13 = s->tags;
                if ((pcVar13[iVar28] != '\0') || (s->levels[iVar28] == 0)) goto LAB_005520f0;
                if ((piVar12[iVar28] != 0) && ((uVar9 >> (s->levels[iVar28] & 0x1fU) & 1) != 0)) {
                  lVar14 = (long)iVar23 + -1;
                  uVar20 = (uint)lVar14;
                  if (uVar20 == (s->stack).cap) {
                    iVar29 = (uVar20 >> 1) * 3;
                    if (iVar23 < 5) {
                      iVar29 = uVar20 * 2;
                    }
                    piVar11 = (int *)realloc(piVar11,(long)iVar29 << 2);
                    (s->stack).ptr = piVar11;
                    if (piVar11 == (int *)0x0) {
                      printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                             SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                             (double)iVar29 * 9.5367431640625e-07);
                      fflush(_stdout);
                    }
                    (s->stack).cap = iVar29;
                    iVar23 = (s->stack).size;
                    lVar14 = (long)iVar23;
                    pcVar13 = s->tags;
                    iVar23 = iVar23 + 1;
                  }
                  (s->stack).size = iVar23;
                  piVar11[lVar14] = iVar28;
                  if (pcVar13[iVar28] == '\0') {
                    uVar20 = (s->tagged).size;
                    piVar12 = (s->tagged).ptr;
                    if (uVar20 == (s->tagged).cap) {
                      iVar23 = (uVar20 >> 1) * 3;
                      if ((int)uVar20 < 4) {
                        iVar23 = uVar20 * 2;
                      }
                      if (piVar12 == (int *)0x0) {
                        piVar12 = (int *)malloc((long)iVar23 << 2);
                      }
                      else {
                        piVar12 = (int *)realloc(piVar12,(long)iVar23 << 2);
                      }
                      (s->tagged).ptr = piVar12;
                      if (piVar12 == (int *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                               (double)iVar23 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                      (s->tagged).cap = iVar23;
                      uVar20 = (s->tagged).size;
                      pcVar13 = s->tags;
                    }
                    (s->tagged).size = uVar20 + 1;
                    piVar12[(int)uVar20] = iVar28;
                  }
                  pcVar13[iVar28] = '\x01';
                  goto LAB_005520f0;
                }
                iVar23 = (s->tagged).size;
                if (iVar8 < iVar23) {
                  piVar12 = (s->tagged).ptr;
                  lVar14 = local_58;
                  do {
                    s->tags[piVar12[lVar14]] = '\0';
                    lVar14 = lVar14 + 1;
                    iVar23 = (s->tagged).size;
                  } while (lVar14 < iVar23);
                }
LAB_0055215a:
                if (iVar23 < iVar8) goto LAB_00552902;
                (s->tagged).size = iVar8;
                uVar20 = local_b8[local_68];
                uVar21 = local_60;
                uVar16 = local_68;
                uVar26 = local_70;
                goto LAB_00552170;
              }
              uVar27 = (s->Mem).uPageMask & uVar20;
              if (uVar27 == 0) goto LAB_00552848;
              piVar12 = (s->Mem).pPages[(int)uVar20 >> ((byte)(s->Mem).nPageSize & 0x1f)];
              uVar20 = piVar12[(int)uVar27];
              if (0xfff < uVar20) {
                uVar21 = 1;
                do {
                  iVar23 = piVar12[(long)(int)uVar27 + uVar21 + 1] >> 1;
                  pcVar13 = s->tags;
                  if ((pcVar13[iVar23] == '\0') && (s->levels[iVar23] != 0)) {
                    if ((s->reasons[iVar23] == 0) ||
                       ((uVar9 >> (s->levels[iVar23] & 0x1fU) & 1) == 0)) {
                      iVar23 = (s->tagged).size;
                      if (iVar8 < iVar23) {
                        piVar12 = (s->tagged).ptr;
                        lVar14 = local_58;
                        do {
                          s->tags[piVar12[lVar14]] = '\0';
                          lVar14 = lVar14 + 1;
                          iVar23 = (s->tagged).size;
                        } while (lVar14 < iVar23);
                      }
                      goto LAB_0055215a;
                    }
                    uVar20 = (s->stack).size;
                    piVar11 = (s->stack).ptr;
                    if (uVar20 == (s->stack).cap) {
                      iVar28 = (uVar20 >> 1) * 3;
                      if ((int)uVar20 < 4) {
                        iVar28 = uVar20 * 2;
                      }
                      if (piVar11 == (int *)0x0) {
                        piVar11 = (int *)malloc((long)iVar28 << 2);
                      }
                      else {
                        piVar11 = (int *)realloc(piVar11,(long)iVar28 << 2);
                      }
                      (s->stack).ptr = piVar11;
                      if (piVar11 == (int *)0x0) {
                        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                               SUB84((double)(s->stack).cap * 9.5367431640625e-07,0),
                               (double)iVar28 * 9.5367431640625e-07);
                        fflush(_stdout);
                      }
                      (s->stack).cap = iVar28;
                      uVar20 = (s->stack).size;
                      pcVar13 = s->tags;
                    }
                    (s->stack).size = uVar20 + 1;
                    piVar11[(int)uVar20] = iVar23;
                    if (pcVar13[iVar23] == '\0') {
                      uVar20 = (s->tagged).size;
                      piVar11 = (s->tagged).ptr;
                      if (uVar20 == (s->tagged).cap) {
                        iVar28 = (uVar20 >> 1) * 3;
                        if ((int)uVar20 < 4) {
                          iVar28 = uVar20 * 2;
                        }
                        if (piVar11 == (int *)0x0) {
                          piVar11 = (int *)malloc((long)iVar28 << 2);
                        }
                        else {
                          piVar11 = (int *)realloc(piVar11,(long)iVar28 << 2);
                        }
                        (s->tagged).ptr = piVar11;
                        if (piVar11 == (int *)0x0) {
                          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                                 SUB84((double)(s->tagged).cap * 9.5367431640625e-07,0),
                                 (double)iVar28 * 9.5367431640625e-07);
                          fflush(_stdout);
                        }
                        (s->tagged).cap = iVar28;
                        uVar20 = (s->tagged).size;
                        pcVar13 = s->tags;
                      }
                      (s->tagged).size = uVar20 + 1;
                      piVar11[(int)uVar20] = iVar23;
                    }
                    pcVar13[iVar23] = '\x01';
                    uVar20 = piVar12[(int)uVar27];
                  }
                  uVar21 = uVar21 + 1;
                } while (uVar21 < uVar20 >> 0xb);
              }
LAB_005520f0:
              iVar23 = (s->stack).size;
              uVar21 = local_60;
              uVar16 = local_68;
              uVar26 = local_70;
            } while (iVar23 != 0);
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar16 != uVar26);
    }
    iVar8 = (int)uVar21;
    if ((int)local_a8 < iVar8) goto LAB_00552902;
    pAVar1 = &(s->stats).tot_literals;
    *pAVar1 = *pAVar1 + (long)iVar8;
    iVar23 = (s->tagged).size;
    if (0 < iVar23) {
      piVar12 = (s->tagged).ptr;
      lVar14 = 0;
      do {
        s->tags[piVar12[lVar14]] = '\0';
        lVar14 = lVar14 + 1;
        iVar23 = (s->tagged).size;
      } while (lVar14 < iVar23);
    }
    if (iVar23 < 0) goto LAB_00552902;
    (s->tagged).size = 0;
    piVar12 = local_40;
    if (1 < iVar8) {
      uVar9 = local_b8[1];
      piVar12 = s->levels;
      if (iVar8 != 2) {
        iVar23 = piVar12[(int)uVar9 >> 1];
        uVar16 = 1;
        uVar26 = 2;
        do {
          if (iVar23 < piVar12[(int)local_b8[uVar26] >> 1]) {
            uVar16 = uVar26 & 0xffffffff;
            iVar23 = piVar12[(int)local_b8[uVar26] >> 1];
          }
          uVar26 = uVar26 + 1;
        } while ((uVar21 & 0xffffffff) != uVar26);
        local_b8[1] = local_b8[(int)uVar16];
        local_b8[(int)uVar16] = uVar9;
        uVar9 = local_b8[1];
      }
      piVar12 = piVar12 + ((int)uVar9 >> 1);
    }
    iVar23 = *piVar12;
    if (*piVar12 < s->root_level) {
      iVar23 = s->root_level;
    }
    sat_solver_canceluntil(s,iVar23);
    iVar23 = 0;
    if (1 < iVar8) {
      iVar23 = sat_solver_clause_new(s,(lit *)local_b8,(lit *)(local_b8 + iVar8),1);
    }
    uVar9 = *local_b8;
    iVar28 = (int)uVar9 >> 1;
    if (s->pFreqs[iVar28] == '\0') {
      s->pFreqs[iVar28] = '\x01';
    }
    if (s->assigns[iVar28] == '\x03') {
      s->assigns[iVar28] = (byte)uVar9 & 1;
      s->levels[iVar28] = (s->trail_lim).size;
      s->reasons[iVar28] = iVar23;
      iVar28 = s->qtail;
      s->qtail = iVar28 + 1;
      s->trail[iVar28] = uVar9;
    }
    if (iVar8 < 1) {
      __assert_fail("veci_size(cls) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x2d0,"void sat_solver_record(sat_solver *, veci *)");
    }
    if (iVar23 == 0) {
      uVar9 = *local_b8;
      uVar20 = (s->unit_lits).size;
      piVar12 = (s->unit_lits).ptr;
      if (uVar20 == (s->unit_lits).cap) {
        iVar23 = (uVar20 >> 1) * 3;
        if ((int)uVar20 < 4) {
          iVar23 = uVar20 * 2;
        }
        if (piVar12 == (int *)0x0) {
          piVar12 = (int *)malloc((long)iVar23 << 2);
        }
        else {
          piVar12 = (int *)realloc(piVar12,(long)iVar23 << 2);
        }
        (s->unit_lits).ptr = piVar12;
        if (piVar12 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 SUB84((double)(s->unit_lits).cap * 9.5367431640625e-07,0),
                 (double)iVar23 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        (s->unit_lits).cap = iVar23;
        uVar20 = (s->unit_lits).size;
      }
      (s->unit_lits).size = uVar20 + 1;
      piVar12[(int)uVar20] = uVar9;
    }
    if (((Sto_Man_t *)s->pStore != (Sto_Man_t *)0x0) &&
       (iVar23 = Sto_ManAddClause((Sto_Man_t *)s->pStore,(lit *)local_b8,(lit *)(local_b8 + iVar8)),
       iVar23 == 0)) {
LAB_0055299a:
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                    ,0x2d9,"void sat_solver_record(sat_solver *, veci *)");
    }
    if (iVar8 == 1) {
      s->levels[(int)*local_b8 >> 1] = 0;
    }
    iVar8 = s->VarActType;
    if (iVar8 == 2) {
      uVar16 = s->var_inc;
      uVar26 = s->var_decay;
      uVar24 = uVar26;
      if (uVar16 >= uVar26 && uVar16 != uVar26) {
        uVar24 = uVar16;
      }
      if (uVar16 < uVar26) {
        uVar26 = uVar16;
      }
      uVar16 = uVar24 >> 0x20 & 0xffff;
      uVar22 = uVar26 >> 0x20 & 0xffff;
      uVar16 = (uVar16 * (uVar26 & 0xffffffff) >> 0xf) + (uVar22 * (uVar24 & 0xffffffff) >> 0xf) +
               ((uVar24 & 0xffffffff) * (uVar26 & 0xffffffff) >> 0x2f | uVar16 * uVar22 * 0x20000);
      uVar22 = uVar16 >> (0xffffffffffff < uVar16);
      uVar16 = (ulong)(0xffffffffffff < uVar16) + (uVar26 >> 0x30) + (uVar24 >> 0x30);
      uVar26 = 0xffffffffffffffff;
      if (uVar16 < 0x10000) {
        if ((uVar22 & 0xffff800000000000) != 0x800000000000) {
LAB_0055280a:
          __assert_fail("!(Exp>>16) && (Mnt>>47)==(word)1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilDouble.h"
                        ,0x36,"xdbl Xdbl_Create(word, word)");
        }
        uVar26 = uVar16 << 0x30 | uVar22;
      }
      s->var_inc = uVar26;
    }
    else if (iVar8 == 1) {
      s->var_inc = (word)((double)s->var_inc * (double)s->var_decay);
    }
    else {
      if (iVar8 != 0) {
LAB_005529be:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                      ,0x1a0,"void act_var_decay(sat_solver *)");
      }
      s->var_inc = (s->var_inc >> 4) + s->var_inc;
    }
    if (s->ClaActType == 0) {
      uVar9 = (s->cla_inc >> 10) + s->cla_inc;
    }
    else {
      uVar9 = s->cla_inc * s->cla_decay;
    }
    s->cla_inc = uVar9;
  }
  if ((local_38 < 0 || local_50 < local_38) || s->fNoRestarts != 0) {
    if ((s->nRuntimeLimit != 0) && (((s->stats).conflicts & 0x3f) == 0)) {
      iVar8 = clock_gettime(3,&local_80);
      if (iVar8 < 0) {
        lVar14 = -1;
      }
      else {
        lVar14 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
      }
      if (s->nRuntimeLimit < lVar14) goto LAB_0055267e;
    }
    if (((s->nConfLimit == 0) || ((s->stats).conflicts <= s->nConfLimit)) &&
       ((s->nInsLimit == 0 || ((s->stats).propagations <= s->nInsLimit)))) {
      if (((s->trail_lim).size == 0) && (s->fSkipSimplify == 0)) {
        sat_solver_simplify(s);
      }
      if ((s->nLearntMax != 0) && (s->nLearntMax <= (s->act_clas).size)) {
        sat_solver_reducedb(s);
      }
      pAVar1 = &(s->stats).decisions;
      *pAVar1 = *pAVar1 + 1;
      piVar12 = s->orderpos;
      dVar31 = s->random_seed * 1389796.0;
      puVar17 = (uint *)(s->order).ptr;
      dVar31 = dVar31 - (double)(int)(dVar31 / 2147483647.0) * 2147483647.0;
      s->random_seed = dVar31;
      if (local_48 <= dVar31 / 2147483647.0) {
LAB_00551508:
        do {
          uVar20 = (s->order).size;
          if ((int)uVar20 < 1) goto LAB_00552578;
          uVar9 = *puVar17;
          uVar25 = uVar20 - 1;
          uVar27 = puVar17[uVar25];
          (s->order).size = uVar25;
          uVar16 = (ulong)(int)uVar9;
          piVar12[uVar16] = -1;
          if (uVar20 != 1) {
            if (uVar20 < 3) {
              iVar8 = 0;
            }
            else {
              pwVar4 = s->activity;
              uVar26 = pwVar4[(int)uVar27];
              iVar23 = 1;
              iVar8 = 0;
              do {
                iVar28 = iVar23 + 1;
                if (((int)uVar25 <= iVar28) ||
                   (pwVar4[(int)puVar17[iVar28]] <= pwVar4[(int)puVar17[iVar23]])) {
                  iVar28 = iVar23;
                }
                uVar20 = puVar17[iVar28];
                if (pwVar4[(int)uVar20] <= uVar26) break;
                puVar17[iVar8] = uVar20;
                piVar12[(int)uVar20] = iVar8;
                iVar23 = iVar28 * 2 + 1;
                iVar8 = iVar28;
              } while (iVar23 < (int)uVar25);
            }
            puVar17[iVar8] = uVar27;
            piVar12[(int)uVar27] = iVar8;
          }
        } while (s->assigns[uVar16] != '\x03');
        if (uVar9 == 0xffffffff) goto LAB_00552578;
      }
      else {
        dVar31 = dVar31 * 1389796.0 -
                 (double)(int)((dVar31 * 1389796.0) / 2147483647.0) * 2147483647.0;
        s->random_seed = dVar31;
        uVar9 = (uint)((double)s->size * (dVar31 / 2147483647.0));
        if (((int)uVar9 < 0) || (s->size <= (int)uVar9)) {
LAB_0055292f:
          __assert_fail("next >= 0 && next < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.c"
                        ,0xb5,"int order_select(sat_solver *, float)");
        }
        uVar16 = (ulong)uVar9;
        if (s->assigns[uVar16] != '\x03') goto LAB_00551508;
      }
      uVar9 = uVar9 * 2;
      if (s->polarity[uVar16] == '\0') {
        uVar9 = uVar9 | 1;
      }
      sat_solver_decision(s,uVar9);
      goto LAB_00551337;
    }
  }
LAB_0055267e:
  dVar31 = sat_solver_progress(s);
  s->progress_estimate = dVar31;
  sat_solver_canceluntil(s,s->root_level);
  cVar18 = '\0';
  goto LAB_005525bf;
LAB_00552578:
  if (0 < s->size) {
    pcVar13 = s->assigns;
    piVar12 = s->model;
    lVar14 = 0;
    do {
      piVar12[lVar14] = -(uint)(pcVar13[lVar14] != '\0') | 1;
      lVar14 = lVar14 + 1;
    } while (lVar14 < s->size);
  }
  sat_solver_canceluntil(s,s->root_level);
  cVar18 = '\x01';
LAB_005525bf:
  if (local_b8 != (uint *)0x0) {
    free(local_b8);
  }
  if (((s->nConfLimit != 0) && (s->nConfLimit < (s->stats).conflicts)) ||
     ((s->nInsLimit != 0 && (s->nInsLimit < (s->stats).propagations)))) goto LAB_005526ba;
  if (s->nRuntimeLimit != 0) {
    iVar8 = clock_gettime(3,&local_80);
    if (iVar8 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_80.tv_nsec / 1000 + local_80.tv_sec * 1000000;
    }
    if (s->nRuntimeLimit < lVar14) goto LAB_005526ba;
  }
  if (((s->pFuncStop != (_func_int_int *)0x0) && (iVar8 = (*s->pFuncStop)(s->RunId), iVar8 != 0)) ||
     (uVar21 = (ulong)(iVar19 + 1), cVar18 != '\0')) goto LAB_005526ba;
  goto LAB_005509f0;
}

Assistant:

int sat_solver_solve_internal(sat_solver* s)
{
    lbool status = l_Undef;
    int restart_iter = 0;
    veci_resize(&s->unit_lits, 0);
    s->nCalls++;

    if (s->verbosity >= 1){
        printf("==================================[MINISAT]===================================\n");
        printf("| Conflicts |     ORIGINAL     |              LEARNT              | Progress |\n");
        printf("|           | Clauses Literals |   Limit Clauses Literals  Lit/Cl |          |\n");
        printf("==============================================================================\n");
    }

    while (status == l_Undef){
        ABC_INT64_T nof_conflicts;
        double Ratio = (s->stats.learnts == 0)? 0.0 :
            s->stats.learnts_literals / (double)s->stats.learnts;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if (s->verbosity >= 1)
        {
            printf("| %9.0f | %7.0f %8.0f | %7.0f %7.0f %8.0f %7.1f | %6.3f %% |\n", 
                (double)s->stats.conflicts,
                (double)s->stats.clauses, 
                (double)s->stats.clauses_literals,
                (double)0, 
                (double)s->stats.learnts, 
                (double)s->stats.learnts_literals,
                Ratio,
                s->progress_estimate*100);
            fflush(stdout);
        }
        nof_conflicts = (ABC_INT64_T)( 100 * luby(2, restart_iter++) );
        status = sat_solver_search(s, nof_conflicts);
        // quit the loop if reached an external limit
        if ( s->nConfLimit && s->stats.conflicts > s->nConfLimit )
            break;
        if ( s->nInsLimit  && s->stats.propagations > s->nInsLimit )
            break;
        if ( s->nRuntimeLimit && Abc_Clock() > s->nRuntimeLimit )
            break;
        if ( s->pFuncStop && s->pFuncStop(s->RunId) )
            break;
    }
    if (s->verbosity >= 1)
        printf("==============================================================================\n");

    sat_solver_canceluntil(s,s->root_level);
    // save variable values
    if ( status == l_True && s->user_vars.size )
    {
        int v;
        for ( v = 0; v < s->user_vars.size; v++ )
            veci_push(&s->user_values, sat_solver_var_value(s, s->user_vars.ptr[v]));
    }
    return status;
}